

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall ExprTest_TooFewBreakpoints_Test::TestBody(ExprTest_TooFewBreakpoints_Test *this)

{
  PLTermBuilder builder_00;
  bool bVar1;
  Reference arg;
  ExprFactory *this_00;
  char *message;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  PLTermBuilder builder;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [2];
  long local_58 [2];
  AssertionResult local_48;
  PLTermBuilder local_38;
  
  local_68[0].ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&(this->super_ExprTest).factory_.exprs_,(Impl **)local_68);
  local_38.impl_ = (Impl *)operator_new__(0x140);
  ((local_38.impl_)->super_Impl).kind_ = PLTERM;
  (this->super_ExprTest).factory_.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_38.impl_;
  (local_38.impl_)->num_breakpoints = 1;
  local_38.slope_index_ = 0;
  local_38.breakpoint_index_ = 0;
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_38,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_38,1.0);
  testing::AssertionSuccess();
  if (local_48.success_ == true) {
    local_68[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"too few breakpoints","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      this_00 = &(this->super_ExprTest).factory_;
      builder_00.slope_index_ = local_38.slope_index_;
      builder_00.breakpoint_index_ = local_38.breakpoint_index_;
      builder_00.impl_ = local_38.impl_;
      arg = mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,0);
      mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(this_00,builder_00,arg);
    }
    testing::AssertionResult::operator<<
              (&local_48,
               (char (*) [139])
               "Expected: factory_.EndPLTerm(builder, factory_.MakeVariable(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58) {
      operator_delete(local_68[0].ptr_,local_58[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_68);
  if (local_48.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x125,
             message);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (((local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_68[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_68[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST_F(ExprTest, TooFewBreakpoints) {
  auto builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddSlope(1);
  EXPECT_ASSERT(factory_.EndPLTerm(builder, factory_.MakeVariable(0)),
                "too few breakpoints");
}